

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_f00bc::preprocessor<baryonyx::raw_problem>::affects
          (preprocessor<baryonyx::raw_problem> *this)

{
  int iVar1;
  context *pcVar2;
  bool bVar3;
  pp_variable_value pVar4;
  const_reference arg1;
  reference pvVar5;
  reference piVar6;
  reference pvVar7;
  const_reference pvVar8;
  __tuple_element_t<0UL,_tuple<int,_bool>_> *p_Var9;
  __tuple_element_t<1UL,_tuple<int,_bool>_> *p_Var10;
  undefined1 local_9c [8];
  tuple<int,_bool> v_2;
  int cst_2;
  iterator __end3_2;
  iterator __begin3_2;
  vector<int,_std::allocator<int>_> *__range3_2;
  tuple<int,_bool> v_1;
  int cst_1;
  iterator __end3_1;
  iterator __begin3_1;
  vector<int,_std::allocator<int>_> *__range3_1;
  tuple<int,_bool> v;
  int cst;
  iterator __end3;
  iterator __begin3;
  vector<int,_std::allocator<int>_> *__range3;
  int local_18;
  bool local_14 [4];
  pp_variable_value top;
  preprocessor<baryonyx::raw_problem> *this_local;
  
  top = (pp_variable_value)this;
  while (bVar3 = pp_lifo::empty(&this->lifo), ((bVar3 ^ 0xffU) & 1) != 0) {
    pVar4 = pp_lifo::pop(&this->lifo);
    local_18 = pVar4.index;
    local_14[0] = pVar4.value;
    std::
    unordered_map<int,bool,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,bool>>>
    ::emplace<int&,bool&>
              ((unordered_map<int,bool,std::hash<int>,std::equal_to<int>,std::allocator<std::pair<int_const,bool>>>
                *)&this->vars,&local_18,local_14);
    pcVar2 = this->ctx;
    arg1 = std::
           vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ::operator[](&(this->pb->vars).names,(long)local_18);
    baryonyx::debug<std::basic_string_view<char,std::char_traits<char>>,bool>
              (pcVar2,"    - variable {} assigned to {}.\n",arg1,local_14);
    pvVar5 = std::
             vector<(anonymous_namespace)::pp_variable_access,_std::allocator<(anonymous_namespace)::pp_variable_access>_>
             ::operator[](&this->cache,(long)local_18);
    __end3 = std::vector<int,_std::allocator<int>_>::begin(&pvVar5->in_equal_constraints);
    register0x00000000 = std::vector<int,_std::allocator<int>_>::end(&pvVar5->in_equal_constraints);
    while (bVar3 = __gnu_cxx::operator==<int_*,_std::vector<int,_std::allocator<int>_>_>
                             (&__end3,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                       *)&v.super__Tuple_impl<0UL,_int,_bool>.
                                          super__Head_base<0UL,_int,_false>),
          ((bVar3 ^ 0xffU) & 1) != 0) {
      piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end3);
      v.super__Tuple_impl<0UL,_int,_bool>._0_4_ = *piVar6;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->equal_constraints,
                          (long)(int)v.super__Tuple_impl<0UL,_int,_bool>._0_4_);
      if (0 < *pvVar7) {
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&this->equal_constraints,
                            (long)(int)v.super__Tuple_impl<0UL,_int,_bool>._0_4_);
        *pvVar7 = *pvVar7 + -1;
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&this->equal_constraints,
                            (long)(int)v.super__Tuple_impl<0UL,_int,_bool>._0_4_);
        if (*pvVar7 == 1) {
          pcVar2 = this->ctx;
          pvVar8 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::
                   operator[](&this->pb->equal_constraints,
                              (long)(int)v.super__Tuple_impl<0UL,_int,_bool>._0_4_);
          baryonyx::debug<std::basic_string_view<char,std::char_traits<char>>>
                    (pcVar2,"      - equal constraint {} will be removed.\n",&pvVar8->label);
          std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::operator[]
                    (&this->pb->equal_constraints,
                     (long)(int)v.super__Tuple_impl<0UL,_int,_bool>._0_4_);
          reduce_equal_constraint
                    ((preprocessor<baryonyx::raw_problem> *)((long)&__range3_1 + 4),
                     (constraint *)this);
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&this->equal_constraints,
                              (long)(int)v.super__Tuple_impl<0UL,_int,_bool>._0_4_);
          *pvVar7 = 0;
          p_Var9 = std::get<0ul,int,bool>((tuple<int,_bool> *)((long)&__range3_1 + 4));
          if (-1 < *p_Var9) {
            p_Var9 = std::get<0ul,int,bool>((tuple<int,_bool> *)((long)&__range3_1 + 4));
            iVar1 = *p_Var9;
            p_Var10 = std::get<1ul,int,bool>((tuple<int,_bool> *)((long)&__range3_1 + 4));
            pp_lifo::emplace(&this->lifo,iVar1,(bool)(*p_Var10 & 1));
          }
        }
      }
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end3);
    }
    pvVar5 = std::
             vector<(anonymous_namespace)::pp_variable_access,_std::allocator<(anonymous_namespace)::pp_variable_access>_>
             ::operator[](&this->cache,(long)local_18);
    __end3_1 = std::vector<int,_std::allocator<int>_>::begin(&pvVar5->in_greater_constraints);
    register0x00000000 =
         std::vector<int,_std::allocator<int>_>::end(&pvVar5->in_greater_constraints);
    while (bVar3 = __gnu_cxx::operator==<int_*,_std::vector<int,_std::allocator<int>_>_>
                             (&__end3_1,
                              (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              &v_1.super__Tuple_impl<0UL,_int,_bool>.
                               super__Head_base<0UL,_int,_false>), ((bVar3 ^ 0xffU) & 1) != 0) {
      piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end3_1);
      v_1.super__Tuple_impl<0UL,_int,_bool>._0_4_ = *piVar6;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->greater_constraints,
                          (long)(int)v_1.super__Tuple_impl<0UL,_int,_bool>._0_4_);
      if (0 < *pvVar7) {
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&this->greater_constraints,
                            (long)(int)v_1.super__Tuple_impl<0UL,_int,_bool>._0_4_);
        *pvVar7 = *pvVar7 + -1;
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&this->greater_constraints,
                            (long)(int)v_1.super__Tuple_impl<0UL,_int,_bool>._0_4_);
        if (*pvVar7 == 1) {
          pcVar2 = this->ctx;
          pvVar8 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::
                   operator[](&this->pb->greater_constraints,
                              (long)(int)v_1.super__Tuple_impl<0UL,_int,_bool>._0_4_);
          baryonyx::debug<std::basic_string_view<char,std::char_traits<char>>>
                    (pcVar2,"      - greater constraint {} will be removed.\n",&pvVar8->label);
          std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::operator[]
                    (&this->pb->greater_constraints,
                     (long)(int)v_1.super__Tuple_impl<0UL,_int,_bool>._0_4_);
          reduce_greater_constraint
                    ((preprocessor<baryonyx::raw_problem> *)((long)&__range3_2 + 4),
                     (constraint *)this);
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&this->greater_constraints,
                              (long)(int)v_1.super__Tuple_impl<0UL,_int,_bool>._0_4_);
          *pvVar7 = 0;
          p_Var9 = std::get<0ul,int,bool>((tuple<int,_bool> *)((long)&__range3_2 + 4));
          if (-1 < *p_Var9) {
            p_Var9 = std::get<0ul,int,bool>((tuple<int,_bool> *)((long)&__range3_2 + 4));
            iVar1 = *p_Var9;
            p_Var10 = std::get<1ul,int,bool>((tuple<int,_bool> *)((long)&__range3_2 + 4));
            pp_lifo::emplace(&this->lifo,iVar1,(bool)(*p_Var10 & 1));
          }
        }
      }
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end3_1);
    }
    pvVar5 = std::
             vector<(anonymous_namespace)::pp_variable_access,_std::allocator<(anonymous_namespace)::pp_variable_access>_>
             ::operator[](&this->cache,(long)local_18);
    __end3_2 = std::vector<int,_std::allocator<int>_>::begin(&pvVar5->in_less_constraints);
    register0x00000000 = std::vector<int,_std::allocator<int>_>::end(&pvVar5->in_less_constraints);
    while (bVar3 = __gnu_cxx::operator==<int_*,_std::vector<int,_std::allocator<int>_>_>
                             (&__end3_2,
                              (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              &v_2.super__Tuple_impl<0UL,_int,_bool>.
                               super__Head_base<0UL,_int,_false>), ((bVar3 ^ 0xffU) & 1) != 0) {
      piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end3_2);
      v_2.super__Tuple_impl<0UL,_int,_bool>._0_4_ = *piVar6;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->less_constraints,
                          (long)(int)v_2.super__Tuple_impl<0UL,_int,_bool>._0_4_);
      if (0 < *pvVar7) {
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&this->less_constraints,
                            (long)(int)v_2.super__Tuple_impl<0UL,_int,_bool>._0_4_);
        *pvVar7 = *pvVar7 + -1;
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&this->less_constraints,
                            (long)(int)v_2.super__Tuple_impl<0UL,_int,_bool>._0_4_);
        if (*pvVar7 == 1) {
          pcVar2 = this->ctx;
          pvVar8 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::
                   operator[](&this->pb->less_constraints,
                              (long)(int)v_2.super__Tuple_impl<0UL,_int,_bool>._0_4_);
          baryonyx::debug<std::basic_string_view<char,std::char_traits<char>>>
                    (pcVar2,"      - less constraint {} will be removed.\n",&pvVar8->label);
          std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::operator[]
                    (&this->pb->less_constraints,
                     (long)(int)v_2.super__Tuple_impl<0UL,_int,_bool>._0_4_);
          reduce_less_constraint((preprocessor<baryonyx::raw_problem> *)local_9c,(constraint *)this)
          ;
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&this->less_constraints,
                              (long)(int)v_2.super__Tuple_impl<0UL,_int,_bool>._0_4_);
          *pvVar7 = 0;
          p_Var9 = std::get<0ul,int,bool>((tuple<int,_bool> *)local_9c);
          if (-1 < *p_Var9) {
            p_Var9 = std::get<0ul,int,bool>((tuple<int,_bool> *)local_9c);
            iVar1 = *p_Var9;
            p_Var10 = std::get<1ul,int,bool>((tuple<int,_bool> *)local_9c);
            pp_lifo::emplace(&this->lifo,iVar1,(bool)(*p_Var10 & 1));
          }
        }
      }
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end3_2);
    }
  }
  return;
}

Assistant:

void affects()
    {
        while (!lifo.empty()) {
            auto top = lifo.pop();
            vars.emplace(top.index, top.value);

            debug(ctx,
                  "    - variable {} assigned to {}.\n",
                  pb.vars.names[top.index],
                  top.value);

            for (int cst : cache[top.index].in_equal_constraints) {
                if (equal_constraints[cst] <= 0)
                    continue;

                --equal_constraints[cst];

                if (equal_constraints[cst] == 1) {
                    debug(ctx,
                          "      - equal constraint {} will be removed.\n",
                          pb.equal_constraints[cst].label);

                    auto v =
                      reduce_equal_constraint(pb.equal_constraints[cst]);
                    equal_constraints[cst] = 0;

                    if (std::get<0>(v) >= 0)
                        lifo.emplace(std::get<0>(v), std::get<1>(v));
                }
            }

            for (int cst : cache[top.index].in_greater_constraints) {
                if (greater_constraints[cst] <= 0)
                    continue;

                --greater_constraints[cst];

                if (greater_constraints[cst] == 1) {
                    debug(ctx,
                          "      - greater constraint {} will be removed.\n",
                          pb.greater_constraints[cst].label);

                    auto v =
                      reduce_greater_constraint(pb.greater_constraints[cst]);
                    greater_constraints[cst] = 0;

                    if (std::get<0>(v) >= 0)
                        lifo.emplace(std::get<0>(v), std::get<1>(v));
                }
            }

            for (int cst : cache[top.index].in_less_constraints) {
                if (less_constraints[cst] <= 0)
                    continue;

                --less_constraints[cst];

                if (less_constraints[cst] == 1) {
                    debug(ctx,
                          "      - less constraint {} will be removed.\n",
                          pb.less_constraints[cst].label);

                    auto v = reduce_less_constraint(pb.less_constraints[cst]);
                    less_constraints[cst] = 0;

                    if (std::get<0>(v) >= 0)
                        lifo.emplace(std::get<0>(v), std::get<1>(v));
                }
            }
        }
    }